

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rasterizer-a3.cpp
# Opt level: O2

void __thiscall
RasterizerA3<16U>::_addLine<long>(RasterizerA3<16U> *this,long x0,long y0,long x1,long y1)

{
  ulong *puVar1;
  uint uVar2;
  uint uVar3;
  BitWord *pBVar4;
  int iVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  long lVar10;
  uint uVar11;
  ulong uVar12;
  ulong uVar13;
  uint uVar14;
  long lVar15;
  uint uVar16;
  int iVar17;
  ulong uVar18;
  ulong uVar19;
  int iVar20;
  ulong uVar21;
  uint uVar22;
  ulong uVar23;
  uint uVar24;
  int iVar25;
  ulong uVar26;
  int iVar27;
  int iVar28;
  uint uVar29;
  uint uVar30;
  uint uVar31;
  ulong uVar32;
  bool bVar33;
  uint local_d4;
  int local_d0;
  int local_cc;
  ulong local_c8;
  uint local_a0;
  long local_90;
  long local_80;
  long local_70;
  int local_60;
  
  uVar23 = y1 - y0;
  if (uVar23 != 0) {
    uVar6 = x1 - x0;
    uVar18 = -uVar6;
    if (0 < (long)uVar6) {
      uVar18 = uVar6;
    }
    uVar6 = -uVar23;
    if (0 < (long)uVar23) {
      uVar6 = uVar23;
    }
    local_cc = 1;
    if (x1 < x0) {
      local_d0 = -1;
      uVar19 = y0;
      local_c8 = x1;
      local_70 = x0;
    }
    else {
      local_d0 = 1;
      uVar19 = y1;
      local_c8 = x0;
      y1 = y0;
      local_70 = x1;
    }
    if ((long)uVar19 < y1) {
      local_cc = -1;
      uVar19 = y1 ^ 0xff;
      lVar15 = (ulong)((char)uVar19 != -1) * 0x200;
      y1 = (uVar19 + lVar15) - 0x1ff;
      uVar19 = (lVar15 + uVar19 + uVar6) - 0x1ff;
      local_d0 = -local_d0;
    }
    uVar26 = local_c8 >> 8;
    uVar30 = (uint)local_c8 & 0xff;
    uVar21 = (ulong)uVar30;
    uVar32 = (ulong)y1 >> 8;
    uVar31 = (uint)((ulong)y1 >> 8);
    iVar27 = (int)(uVar19 >> 8);
    iVar28 = iVar27 - uVar31;
    iVar17 = (int)(local_c8 >> 8);
    if ((int)(uVar30 + (int)uVar18) < 0x101 && iVar28 == 0) {
      uVar16 = (this->_yBounds).start;
      uVar29 = (this->_yBounds).end;
      if ((int)uVar31 <= (int)uVar16) {
        uVar16 = uVar31;
      }
      (this->_yBounds).start = uVar16;
      if ((int)uVar29 <= (int)uVar31) {
        uVar29 = uVar31;
      }
      (this->_yBounds).end = uVar29;
      this->_bits
      [(long)(int)uVar31 * this->_bitStride + (ulong)((uint)(local_c8 >> 0x12) & 0x3fffff)] =
           this->_bits
           [(long)(int)uVar31 * this->_bitStride + (ulong)((uint)(local_c8 >> 0x12) & 0x3fffff)] |
           1L << ((byte)(local_c8 >> 0xc) & 0x3f);
      _mergeCell(this,iVar17,uVar31,(int)uVar23,((int)uVar18 + uVar30 * 2) * (int)uVar23);
      return;
    }
    uVar22 = (uint)y1 & 0xff;
    uVar14 = (uint)uVar19 & 0xff;
    uVar16 = (uint)((uVar19 & 0xff) != 0);
    uVar24 = (uVar16 + iVar28) * local_cc + uVar31;
    uVar29 = uVar31;
    if (uVar24 < uVar31) {
      uVar29 = uVar24;
    }
    uVar11 = uVar31;
    if (uVar31 < uVar24) {
      uVar11 = uVar24;
    }
    uVar2 = (this->_yBounds).start;
    uVar3 = (this->_yBounds).end;
    if ((int)uVar2 < (int)uVar29) {
      uVar29 = uVar2;
    }
    (this->_yBounds).start = uVar29;
    if ((int)uVar11 < (int)uVar3) {
      uVar11 = uVar3;
    }
    (this->_yBounds).end = uVar11;
    if (x1 != x0) {
      uVar19 = (uVar18 << 8) / uVar6;
      uVar12 = (uVar18 << 8) % uVar6;
      uVar13 = (uVar6 << 8) % uVar18;
      uVar7 = 0;
      uVar23 = uVar18;
      local_d4 = uVar14;
      if (iVar28 != 0) {
        uVar7 = (0x100 - uVar22) * uVar18;
        uVar23 = uVar7 / uVar6;
        uVar7 = uVar7 % uVar6;
        local_d4 = 0x100;
      }
      if (iVar17 == (int)((ulong)local_70 >> 8)) {
        uVar8 = 0;
        uVar9 = uVar6;
      }
      else {
        uVar8 = (0x100 - uVar30) * uVar6;
        uVar9 = uVar8 / uVar18;
        uVar8 = uVar8 % uVar18;
      }
      local_90 = uVar8 - (uVar18 >> 1);
      local_80 = uVar7 - (uVar6 >> 1);
      local_60 = (int)((uVar6 << 8) / uVar18);
      if (uVar6 < uVar18) {
        uVar16 = uVar22 + (int)uVar9;
        if ((int)(uVar30 + (int)uVar23) < 0x101) {
          local_c8 = local_c8 + uVar23;
          iVar27 = (local_d4 - uVar22) * local_d0;
          iVar20 = ((int)uVar23 + uVar30 * 2) * iVar27;
          iVar17 = 0;
          goto LAB_00109fca;
        }
        iVar17 = 1;
        do {
          local_c8 = local_c8 + uVar23;
          iVar27 = (int)(local_c8 >> 8);
          if ((int)uVar26 == iVar27) {
            __assert_fail("ex0 != ex1",
                          "/workspace/llm4binary/github/license_c_cmakelists/kobalicek[P]b2drefras/rasterizer-a3.cpp"
                          ,0x1e7,
                          "void RasterizerA3<16>::_addLine(Fixed, Fixed, Fixed, Fixed) [N = 16, Fixed = long]"
                         );
          }
          bVar33 = (local_c8 & 0xff) != 0;
          local_a0 = (uint)local_c8 & 0xff;
          iVar25 = ((int)uVar21 + 0x100) * (int)uVar9;
          iVar20 = (int)uVar32;
          uVar23 = uVar26 >> 4 & 0xfffffff;
          IntUtils::bitVectorFill<unsigned_long>
                    (this->_bits + (long)iVar20 * this->_bitStride,uVar23,
                     (ulong)((((uint)bVar33 + iVar27 >> 4) - (int)uVar23) + 1));
          iVar27 = (uint)bVar33 + iVar27 + -1;
          while( true ) {
            iVar5 = (int)uVar26;
            if (iVar27 == iVar5) break;
            _mergeCell(this,iVar5,iVar20,(int)uVar9 * local_d0,iVar25 * local_d0);
            lVar15 = local_90 + uVar13;
            uVar23 = 0;
            if (-1 < lVar15) {
              uVar23 = uVar18;
            }
            local_90 = lVar15 - uVar23;
            uVar30 = (uint)(-1 < lVar15) + local_60;
            uVar9 = (ulong)uVar30;
            uVar16 = uVar16 + uVar30;
            iVar25 = uVar30 * 0x100;
            uVar26 = (ulong)(iVar5 + 1);
          }
          uVar30 = 0x100;
          if ((local_c8 & 0xff) != 0) {
            uVar30 = local_a0;
          }
          iVar25 = ((local_d4 - uVar16) + (int)uVar9) * local_d0;
          _mergeCell(this,iVar27,iVar20,iVar25,uVar30 * iVar25);
          if ((local_c8 & 0xff) == 0) {
            uVar16 = uVar16 + local_60;
            local_90 = local_90 + uVar13;
            if (-1 < local_90) {
              local_90 = local_90 - uVar18;
              uVar16 = uVar16 + 1;
            }
          }
          uVar32 = (ulong)(uint)(iVar20 + local_cc);
          iVar17 = iVar17 + -1;
          if (iVar17 == 0) {
            if (iVar20 + local_cc == uVar24) {
              return;
            }
            do {
              uVar31 = (uint)uVar32;
              if (1 < iVar28) {
                iVar17 = iVar28 + -1;
                local_d4 = 0x100;
                iVar28 = 1;
                break;
              }
              uVar23 = local_70 - local_c8;
              uVar26 = local_c8 >> 8;
              uVar21 = local_c8 & 0xff;
              uVar30 = (uint)uVar21;
              if (0x100 < (int)(uVar30 + (int)uVar23)) {
                local_d4 = uVar14;
                iVar17 = iVar28;
                iVar28 = 1;
                goto LAB_0010a0a0;
              }
              iVar27 = uVar14 * local_d0;
              iVar20 = ((int)uVar23 + uVar30 * 2) * iVar27;
              iVar17 = iVar28 + -1;
              iVar28 = 1;
              local_d4 = uVar14;
LAB_00109fca:
              this->_bits[this->_bitStride * (long)(int)uVar31 + (uVar26 >> 10 & 0x3fffff)] =
                   this->_bits[this->_bitStride * (long)(int)uVar31 + (uVar26 >> 10 & 0x3fffff)] |
                   1L << ((byte)(uVar26 >> 4) & 0x3f);
              _mergeCell(this,(int)uVar26,uVar31,iVar27,iVar20);
              uVar32 = (ulong)(uVar31 + local_cc);
              if (uVar31 + local_cc == uVar24) {
                return;
              }
              if (uVar30 + (int)uVar23 == 0x100) {
                uVar16 = uVar16 + local_60;
                local_90 = local_90 + uVar13;
                if (-1 < local_90) {
                  local_90 = local_90 - uVar18;
                  uVar16 = uVar16 + 1;
                }
              }
            } while (iVar17 == 0);
          }
          lVar15 = local_80 + uVar12;
          uVar23 = 0;
          if (-1 < lVar15) {
            uVar23 = uVar6;
          }
          local_80 = lVar15 - uVar23;
          uVar23 = (-1 < lVar15) + uVar19;
          uVar26 = local_c8 >> 8;
          uVar21 = local_c8 & 0xff;
LAB_0010a0a0:
          uVar16 = uVar16 - 0x100;
          uVar9 = (ulong)uVar16;
          if (0x100 < uVar16) {
            __assert_fail("cover >= 0 && cover <= 256",
                          "/workspace/llm4binary/github/license_c_cmakelists/kobalicek[P]b2drefras/rasterizer-a3.cpp"
                          ,0x1e0,
                          "void RasterizerA3<16>::_addLine(Fixed, Fixed, Fixed, Fixed) [N = 16, Fixed = long]"
                         );
          }
        } while( true );
      }
      uVar30 = (int)uVar9 + (uint)y1;
      local_c8._0_4_ = 1;
LAB_00109d90:
      lVar15 = (long)(int)uVar32;
      do {
        iVar25 = (int)uVar21;
        uVar29 = (int)uVar23 + iVar25;
        iVar20 = (int)uVar26;
        iVar17 = (int)lVar15;
        if ((int)uVar29 < 0x101) {
          iVar5 = (local_d4 - uVar22) * local_d0;
          this->_bits[this->_bitStride * lVar15 + (uVar26 >> 10 & 0x3fffff)] =
               this->_bits[this->_bitStride * lVar15 + (uVar26 >> 10 & 0x3fffff)] |
               1L << ((byte)(uVar26 >> 4) & 0x3f);
          _mergeCell(this,iVar20,iVar17,iVar5,(iVar25 + uVar29) * iVar5);
          if (uVar29 == 0x100) {
            uVar21 = 0;
            goto LAB_00109eb7;
          }
          uVar21 = (ulong)uVar29;
        }
        else {
          uVar30 = uVar30 & 0xff;
          iVar5 = (uVar30 - uVar22) * local_d0;
          this->_bits[this->_bitStride * lVar15 + (uVar26 >> 10 & 0x3fffff)] =
               this->_bits[this->_bitStride * lVar15 + (uVar26 >> 10 & 0x3fffff)] |
               1L << ((byte)(uVar26 >> 4) & 0x3f);
          _mergeCell(this,iVar20,iVar17,iVar5,(iVar25 + 0x100) * iVar5);
          uVar24 = iVar20 + 1;
          iVar25 = (local_d4 - uVar30) * local_d0;
          this->_bits[this->_bitStride * lVar15 + (ulong)(uVar24 >> 10)] =
               this->_bits[this->_bitStride * lVar15 + (ulong)(uVar24 >> 10)] |
               1L << ((byte)(uVar24 >> 4) & 0x3f);
          _mergeCell(this,uVar24,iVar17,iVar25,iVar25 * (uVar29 & 0xff));
          uVar21 = (ulong)(uVar29 & 0xff);
LAB_00109eb7:
          uVar26 = (ulong)(iVar20 + 1);
          uVar30 = uVar30 + local_60;
          local_90 = local_90 + uVar13;
          if (-1 < local_90) {
            local_90 = local_90 - uVar18;
            uVar30 = uVar30 + 1;
          }
        }
        local_c8._0_4_ = (int)local_c8 + -1;
        if ((int)local_c8 != 0) goto LAB_00109f6e;
        if ((~uVar31 + uVar16 + iVar27) * local_cc + uVar31 == iVar17) {
          return;
        }
        if (1 < iVar28) goto LAB_00109f4f;
        lVar15 = lVar15 + local_cc;
        uVar23 = local_70 - (uVar21 + (uint)((int)uVar26 << 8));
        uVar22 = 0;
        local_d4 = uVar14;
        local_c8._0_4_ = iVar28;
        iVar28 = 1;
      } while( true );
    }
    uVar23 = uVar23 & 0xffffffff;
    if (0 < iVar28) {
      uVar23 = (ulong)((0x100 - uVar22) * local_d0);
    }
    pBVar4 = this->_bits;
    iVar27 = 1;
    while( true ) {
      uVar32 = (ulong)(int)uVar32;
      do {
        puVar1 = (ulong *)((long)pBVar4 +
                          this->_bitStride * uVar32 * 8 +
                          (ulong)(((uint)(local_c8 >> 0x12) & 0x3fffff) << 3));
        *puVar1 = *puVar1 | 1L << ((byte)(local_c8 >> 0xc) & 0x3f);
        _mergeCell(this,iVar17,(int)uVar32,(int)uVar23,uVar30 * 2 * (int)uVar23);
        uVar32 = uVar32 + (long)local_cc;
        iVar27 = iVar27 + -1;
      } while (iVar27 != 0);
      if (uVar24 == (uint)uVar32) break;
      uVar31 = uVar14 * local_d0;
      if (1 < iVar28) {
        uVar31 = local_d0 << 8;
      }
      uVar23 = (ulong)uVar31;
      iVar27 = iVar28 - (uint)(1 < iVar28);
      iVar28 = 1;
    }
  }
  return;
LAB_00109f4f:
  local_c8._0_4_ = iVar28 + -1;
  uVar22 = 0;
  local_d4 = 0x100;
  iVar28 = 1;
LAB_00109f6e:
  lVar10 = local_80 + uVar12;
  uVar23 = 0;
  if (-1 < lVar10) {
    uVar23 = uVar6;
  }
  local_80 = lVar10 - uVar23;
  uVar23 = (-1 < lVar10) + uVar19;
  uVar32 = lVar15 + local_cc;
  goto LAB_00109d90;
}

Assistant:

void RasterizerA3<N>::_addLine(Fixed x0, Fixed y0, Fixed x1, Fixed y1) noexcept {
  Fixed dx = x1 - x0;
  Fixed dy = y1 - y0;

  if (dy == Fixed(0))
    return;

  int cover = int(dy);
  int area;

  if (dx < 0) dx = -dx;
  if (dy < 0) dy = -dy;

  int yInc = 1;
  int coverSign = 1;

  // Fix RIGHT-TO-LEFT direction:
  //   - swap coordinates,
  //   - invert cover-sign.
  if (x0 > x1) {
    std::swap(x0, x1);
    std::swap(y0, y1);
    coverSign = -coverSign;
  }

  // Fix BOTTOM-TO-TOP direction:
  //   - invert fractional parts of y0 and y1,
  //   - invert cover-sign.
  if (y0 > y1) {
    y0 ^= kA8Mask;
    y0 += int(y0 & kA8Mask) == kA8Mask ? 1 - kA8Scale * 2 : 1;
    y1  = y0 + dy;

    yInc = -1;
    coverSign = -coverSign;
  }

  // Extract the raster and fractional coordinates.
  int ex0 = int(x0 >> kA8Shift);
  int fx0 = int(x0 & kA8Mask);

  int ey0 = int(y0 >> kA8Shift);
  int fy0 = int(y0 & kA8Mask);

  int ex1 = int(x1 >> kA8Shift);
  int fy1 = int(y1 & kA8Mask);

  // NOTE: Variable `i` is just a loop counter. We need to make sure to handle
  // the start and end points of the line, which use the same loop body, but
  // require special handling.
  //
  //   - `i` - How many Y iterations to do now.
  //   - `j` - How many Y iterations to do next.
  int i = 1;
  int j = int(y1 >> kA8Shift) - ey0;

  // Single-Cell.
  if ((j | ((fx0 + int(dx)) > 256)) == 0) {
    _yBounds.union_(ey0, ey0);
    IntUtils::bitVectorSetBit(&_bits[ey0 * _bitStride], ex0 / kPixelsPerOneBit, true);

    _mergeCell(ex0, ey0, cover, (fx0 * 2 + int(dx)) * cover);
    return;
  }

  uint32_t ey1 = ey0 + (j + (fy1 != 0)) * yInc;
  if (ey0 <= ey1)
    _yBounds.union_(ey0, ey1);
  else
    _yBounds.union_(ey1, ey0);

  // Strictly horizontal line (always one cell per scanline).
  if (dx == 0) {
    if (j > 0)
      cover = (kA8Scale - fy0) * coverSign;

    fy0  = coverSign << kA8Shift;
    fy1 *= coverSign;
    fx0 *= 2;

    size_t bitIndex = ex0 / kPixelsPerOneBit;
    BitWord* bitBase = _bits + (bitIndex / kBitWordBits);
    BitWord bitMask = BitWord(1) << (bitIndex % kBitWordBits);

    for (;;) {
      area = fx0 * cover;
      do {
        bitBase[ey0 * _bitStride] |= bitMask;
        _mergeCell(ex0, ey0, cover, area);
        ey0 += yInc;
      } while (--i);

      if (ey0 == ey1)
        break;

      cover = fy1;
      i = j;
      j = 1;

      if (i <= 1)
        continue;

      cover = fy0;
      i--;
    }

    return;
  }

  Fixed xErr = -dy / 2, xBase, xLift, xRem, xDlt = dx;
  Fixed yErr = -dx / 2, yBase, yLift, yRem, yDlt = dy;

  xBase = dx * kA8Scale;
  xLift = xBase / dy;
  xRem  = xBase % dy;

  yBase = dy * kA8Scale;
  yLift = yBase / dx;
  yRem  = yBase % dx;

  if (j != 0) {
    Fixed p = Fixed(kA8Scale - fy0) * dx;
    xDlt  = p / dy;
    xErr += p % dy;
    fy1 = kA8Scale;
  }

  if (ex0 != ex1) {
    Fixed p = Fixed(kA8Scale - fx0) * dy;
    yDlt = p / dx;
    yErr += p % dx;
  }

  // Vertical direction -> One/Two cells per scanline.
  if (dy >= dx) {
    int yAcc = int(y0) + int(yDlt);

    goto VertSkip;
    for (;;) {
      do {
        xDlt = xLift;
        xErr += xRem;
        if (xErr >= 0) { xErr -= dy; xDlt++; }

VertSkip:
        area = fx0;
        fx0 += int(xDlt);

        if (fx0 <= 256) {
          cover = (fy1 - fy0) * coverSign;
          area  = (area + fx0) * cover;

          IntUtils::bitVectorSetBit(&_bits[ey0 * _bitStride], ex0 / kPixelsPerOneBit, true);
          _mergeCell(ex0, ey0, cover, area);

          if (fx0 == 256) {
            ex0++;
            fx0 = 0;
            goto VertAdvance;
          }
        }
        else {
          yAcc &= 0xFF;
          fx0  &= kA8Mask;

          cover = (yAcc - fy0) * coverSign;
          area  = (area + kA8Scale) * cover;

          IntUtils::bitVectorSetBit(&_bits[ey0 * _bitStride], ex0 / kPixelsPerOneBit, true);
          _mergeCell(ex0, ey0, cover, area);
          ex0++;

          cover = (fy1 - yAcc) * coverSign;
          area  = fx0 * cover;
          IntUtils::bitVectorSetBit(&_bits[ey0 * _bitStride], ex0 / kPixelsPerOneBit, true);
          _mergeCell(ex0, ey0, cover, area);

VertAdvance:
          yAcc += int(yLift);
          yErr += yRem;
          if (yErr >= 0) { yErr -= dx; yAcc++; }
        }

        ey0 += yInc;
      } while (--i);

      if (ey0 == ey1)
        break;

      i = j;
      j = 1;

      if (i > 1) {
        fy0 = 0;
        fy1 = kA8Scale;
        i--;
      }
      else {
        fy0 = 0;
        fy1 = int(y1 & kA8Mask);

        xDlt = x1 - (ex0 << 8) - fx0;
        goto VertSkip;
      }
    }

    return;
  }
  // Horizontal direction -> Two or more cells per scanline.
  else {
    int fx1;
    int coverAcc = fy0;

    cover = int(yDlt);
    coverAcc += cover;

    if (j != 0)
      fy1 = kA8Scale;

    if (fx0 + int(xDlt) > 256)
      goto HorzInside;

    x0 += xDlt;

    cover = (fy1 - fy0) * coverSign;
    area = (fx0 * 2 + int(xDlt)) * cover;

HorzSingle:
    IntUtils::bitVectorSetBit(&_bits[ey0 * _bitStride], ex0 / kPixelsPerOneBit, true);
    _mergeCell(ex0, ey0, cover, area);

    ey0 += yInc;
    if (ey0 == ey1)
      return;

    if (fx0 + int(xDlt) == 256) {
      coverAcc += int(yLift);
      yErr += yRem;
      if (yErr >= 0) { yErr -= dx; coverAcc++; }
    }

    if (--i == 0)
      goto HorzAfter;

    for (;;) {
      do {
        xDlt = xLift;
        xErr += xRem;
        if (xErr >= 0) { xErr -= dy; xDlt++; }

        ex0 = int(x0 >> kA8Shift);
        fx0 = int(x0 & kA8Mask);

HorzSkip:
        coverAcc -= 256;
        cover = coverAcc;
        assert(cover >= 0 && cover <= 256);

HorzInside:
        x0 += xDlt;

        ex1 = int(x0 >> kA8Shift);
        fx1 = int(x0 & kA8Mask);
        assert(ex0 != ex1);

        if (fx1 == 0)
          fx1 = kA8Scale;
        else
          ex1++;

        area = (fx0 + kA8Scale) * cover;
        IntUtils::bitVectorFill(&_bits[ey0 * _bitStride], ex0 / kPixelsPerOneBit, (ex1 / kPixelsPerOneBit) - (ex0 / kPixelsPerOneBit) + 1);

        while (ex0 != ex1 - 1) {
          _mergeCell(ex0, ey0, cover * coverSign, area * coverSign);

          cover = int(yLift);
          yErr += yRem;
          if (yErr >= 0) { yErr -= dx; cover++; }

          coverAcc += cover;
          area  = kA8Scale * cover;

          ex0++;
        }

        cover += fy1 - coverAcc;
        area   = fx1 * cover;
        _mergeCell(ex0, ey0, cover * coverSign, area * coverSign);

        if (fx1 == kA8Scale) {
          coverAcc += int(yLift);
          yErr += yRem;
          if (yErr >= 0) { yErr -= dx; coverAcc++; }
        }

        ey0 += yInc;
      } while (--i);

      if (ey0 == ey1)
        break;

HorzAfter:
      i = j;
      j = 1;

      if (i > 1) {
        fy1 = kA8Scale;
        i--;
      }
      else {
        fy1 = int(y1 & kA8Mask);
        xDlt = x1 - x0;

        ex0 = int(x0 >> kA8Shift);
        fx0 = int(x0 & kA8Mask);

        if (fx0 + int(xDlt) <= 256) {
          cover = fy1 * coverSign;
          area = (fx0 * 2 + int(xDlt)) * cover;
          goto HorzSingle;
        }
        else {
          goto HorzSkip;
        }
      }
    }

    return;
  }
}